

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

string * __thiscall
pbrt::syntactic::ParamArray<pbrt::syntactic::Texture>::toString_abi_cxx11_
          (string *__return_storage_ptr__,ParamArray<pbrt::syntactic::Texture> *this)

{
  ostream *poVar1;
  stringstream ss;
  char *local_1b8;
  long local_1b0;
  char local_1a8 [16];
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(local_198);
  (**(this->super_Param)._vptr_Param)(&local_1b8,this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(local_188,local_1b8,local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_188,"[ ",2);
  std::__ostream_insert<char,std::char_traits<char>>(local_188,"<TODO>",6);
  std::__ostream_insert<char,std::char_traits<char>>(local_188,"]",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

std::string ParamArray<Texture>::toString() const
    { 
      std::stringstream ss;
      ss << getType() << " ";
      ss << "[ ";
      ss << "<TODO>";
      ss << "]";
      return ss.str();
    }